

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

void __thiscall xemmai::ast::t_symbol_get::f_flow(t_symbol_get *this,t_flow *a_flow)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  iterator iStack_30;
  int i;
  _Self local_28;
  iterator i_1;
  t_scope *scope;
  t_flow *a_flow_local;
  t_symbol_get *this_local;
  
  this->v_resolved = this->v_outer;
  i_1._M_node = (_Base_ptr)this->v_scope;
  do {
    if (i_1._M_node == (_Base_ptr)0x0) {
LAB_001aee1e:
      if (((this->v_variable != (t_variable *)0x0) && ((this->v_variable->v_shared & 1U) == 0)) &&
         (iVar2 = (int)this->v_variable->v_index - (int)a_flow->v_arguments, -1 < iVar2)) {
        t_block::f_use(a_flow->v_current,(long)iVar2,false);
      }
      return;
    }
    local_28._M_node =
         (_Base_ptr)
         std::
         map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
         ::find((map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
                 *)&i_1._M_node[4]._M_parent,&this->v_symbol);
    iStack_30 = std::
                map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
                ::end((map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
                       *)&i_1._M_node[4]._M_parent);
    bVar1 = std::operator==(&local_28,&stack0xffffffffffffffd0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>::
               operator->(&local_28);
      this->v_variable = &ppVar3->second;
      goto LAB_001aee1e;
    }
    this->v_resolved = this->v_resolved + 1;
    i_1._M_node = *i_1._M_node;
  } while( true );
}

Assistant:

void t_symbol_get::f_flow(t_flow& a_flow)
{
	v_resolved = v_outer;
	for (auto scope = v_scope; scope; scope = scope->v_outer) {
		auto i = scope->v_variables.find(v_symbol);
		if (i != scope->v_variables.end()) {
			v_variable = &i->second;
			break;
		}
		++v_resolved;
	}
	if (!v_variable || v_variable->v_shared) return;
	int i = v_variable->v_index - a_flow.v_arguments;
	if (i >= 0) a_flow.v_current->f_use(i, false);
}